

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O0

int http_sendfile2(http_s *h,char *prefix,size_t prefix_len,char *encoded,size_t encoded_len)

{
  fio_str_info_s n;
  fio_str_info_s v;
  size_t sVar1;
  __dev_t _Var2;
  int iVar3;
  char *pcVar4;
  FIOBJ FVar5;
  size_t sVar6;
  FIOBJ FVar7;
  bool bVar8;
  size_t local_260;
  uintptr_t pos_2;
  FIOBJ tmp_4;
  size_t local_248;
  char *local_240;
  undefined8 local_238;
  undefined8 local_230;
  char *local_228;
  undefined8 local_220;
  undefined8 local_218;
  char *local_210;
  fio_str_info_s local_208;
  FIOBJ local_1f0;
  FIOBJ cranges;
  int64_t end_at;
  int64_t start_at;
  char *pos_1;
  fio_str_info_s range;
  FIOBJ tmp_3;
  int64_t length;
  int64_t offset;
  FIOBJ tmp2;
  char *local_188;
  FIOBJ local_180;
  FIOBJ etag_str;
  uint64_t etag;
  char *local_160;
  FIOBJ local_158;
  FIOBJ tmp_2;
  size_t local_148;
  char *local_140;
  undefined1 local_138 [8];
  fio_str_info_s ac_str;
  FIOBJ tmp_1;
  fio_str_info_s s;
  uint8_t is_gz;
  int file;
  char *end;
  char *pos;
  fio_str_info_s tmp;
  FIOBJ filename;
  stat file_data;
  size_t encoded_len_local;
  char *encoded_local;
  size_t prefix_len_local;
  char *prefix_local;
  http_s *h_local;
  
  if ((h == (http_s *)0x0) || (((h->method == 0 && (h->status_str == 0)) && (h->status != 0)))) {
    return -1;
  }
  file_data.__glibc_reserved[2] = encoded_len;
  memset(&filename,0,0x90);
  if (http_sendfile2::accept_enc_hash == 0) {
    http_sendfile2::accept_enc_hash = fiobj_hash_string("accept-encoding",0xf);
  }
  if (http_sendfile2::range_hash == 0) {
    http_sendfile2::range_hash = fiobj_hash_string("range",5);
  }
  tmp.data = (char *)fiobj_str_tmp();
  encoded_local = (char *)prefix_len;
  if ((prefix != (char *)0x0) && (prefix_len != 0)) {
    if ((encoded != (char *)0x0) && ((prefix[prefix_len - 1] == '/' && (*encoded == '/')))) {
      encoded_local = (char *)(prefix_len - 1);
    }
    fiobj_str_capa_assert
              ((FIOBJ)tmp.data,(size_t)(encoded_local + file_data.__glibc_reserved[2] + 4));
    fiobj_str_write((FIOBJ)tmp.data,prefix,(size_t)encoded_local);
  }
  fiobj_obj2cstr((fio_str_info_s *)&pos,(FIOBJ)tmp.data);
  if (encoded != (char *)0x0) {
    pcVar4 = encoded + file_data.__glibc_reserved[2];
    end = encoded;
    while (end < pcVar4) {
      if (*end == '%') {
        iVar3 = hex2byte((uint8_t *)(tmp.len + tmp.capa),(uint8_t *)(end + 1));
        if (iVar3 != 0) {
          return -1;
        }
        end = end + 3;
      }
      else {
        *(char *)(tmp.len + tmp.capa) = *end;
        end = end + 1;
      }
      tmp.capa = tmp.capa + 1;
    }
    *(undefined1 *)(tmp.len + tmp.capa) = 0;
    fiobj_str_resize((FIOBJ)tmp.data,tmp.capa);
    iVar3 = http_test_encoded_path(encoded_local + tmp.len,tmp.capa - (long)encoded_local);
    if (iVar3 != 0) {
      return -1;
    }
  }
  if (*(char *)(tmp.len + (tmp.capa - 1)) == '/') {
    fiobj_str_write((FIOBJ)tmp.data,"index.html",10);
  }
  s.data._4_4_ = 0xffffffff;
  s.data._3_1_ = '\0';
  fiobj_obj2cstr((fio_str_info_s *)&tmp_1,(FIOBJ)tmp.data);
  ac_str.data = (char *)fiobj_hash_get2(h->headers,http_sendfile2::accept_enc_hash);
  if ((((ac_str.data == (char *)0x0) ||
       (fiobj_obj2cstr((fio_str_info_s *)local_138,(FIOBJ)ac_str.data), ac_str.len == 0)) ||
      (pcVar4 = strstr((char *)ac_str.len,"gzip"), pcVar4 == (char *)0x0)) ||
     (((*(char *)(s.len + (s.capa - 3)) == '.' && (*(char *)(s.len + (s.capa - 2)) == 'g')) &&
      (*(char *)(s.len + (s.capa - 1)) == 'z')))) {
LAB_00171ad6:
    iVar3 = stat((char *)s.len,(stat *)&filename);
    if ((iVar3 != 0) ||
       ((((uint)file_data.st_nlink & 0xf000) != 0x8000 &&
        (((uint)file_data.st_nlink & 0xf000) != 0xa000)))) {
      return -1;
    }
  }
  else {
    fiobj_str_write((FIOBJ)tmp.data,".gz",3);
    fiobj_obj2cstr((fio_str_info_s *)&tmp_2,(FIOBJ)tmp.data);
    tmp_1 = tmp_2;
    s.capa = local_148;
    s.len = (size_t)local_140;
    iVar3 = stat(local_140,(stat *)&filename);
    if ((iVar3 != 0) ||
       ((((uint)file_data.st_nlink & 0xf000) != 0x8000 &&
        (((uint)file_data.st_nlink & 0xf000) != 0xa000)))) {
      fiobj_str_resize((FIOBJ)tmp.data,s.capa - 3);
      goto LAB_00171ad6;
    }
    s.data._3_1_ = '\x01';
  }
  FVar5 = fiobj_str_buf(0x20);
  local_158 = FVar5;
  fiobj_obj2cstr((fio_str_info_s *)&etag,FVar5);
  sVar6 = http_time2str(local_160,file_data.st_atim.tv_nsec);
  fiobj_str_resize(FVar5,sVar6);
  http_set_header(h,HTTP_HEADER_LAST_MODIFIED,local_158);
  FVar5 = HTTP_HEADER_CACHE_CONTROL;
  FVar7 = fiobj_dup(HTTP_HVALUE_MAX_AGE);
  http_set_header(h,FVar5,FVar7);
  etag_str = file_data.st_atim.tv_nsec ^ file_data.st_rdev;
  etag_str = fiobj_hash_string(&etag_str,8);
  FVar5 = fiobj_str_buf(0x20);
  local_180 = FVar5;
  fiobj_obj2cstr((fio_str_info_s *)&tmp2,FVar5);
  iVar3 = fio_base64_encode(local_188,(char *)&etag_str,8);
  fiobj_str_resize(FVar5,(long)iVar3);
  http_set_header(h,HTTP_HEADER_ETAG,local_180);
  if (http_sendfile2::none_match_hash == 0) {
    http_sendfile2::none_match_hash = fiobj_hash_string("if-none-match",0xd);
  }
  FVar5 = fiobj_hash_get2(h->headers,http_sendfile2::none_match_hash);
  if ((FVar5 != 0) && (iVar3 = fiobj_iseq(FVar5,local_180), iVar3 != 0)) {
    h->status = 0x130;
    http_finish(h);
    return 0;
  }
  _Var2 = file_data.st_rdev;
  length = 0;
  tmp_3 = file_data.st_rdev;
  if (http_sendfile2::ifrange_hash == 0) {
    http_sendfile2::ifrange_hash = fiobj_hash_string("if-range",8);
  }
  range.data = (char *)fiobj_hash_get2(h->headers,http_sendfile2::ifrange_hash);
  if ((range.data == (char *)0x0) || (iVar3 = fiobj_iseq((FIOBJ)range.data,local_180), iVar3 == 0))
  {
    range.data = (char *)fiobj_hash_get2(h->headers,http_sendfile2::range_hash);
    if (range.data == (char *)0x0) goto LAB_00172031;
    sVar6 = fiobj_type_is((FIOBJ)range.data,FIOBJ_T_ARRAY);
    if (sVar6 != 0) {
      range.data = (char *)fiobj_ary_index((FIOBJ)range.data,0);
    }
    fiobj_obj2cstr((fio_str_info_s *)&pos_1,(FIOBJ)range.data);
    if ((range.len != 0) && (iVar3 = memcmp("bytes=",(void *)range.len,6), iVar3 == 0)) {
      start_at = range.len + 6;
      end_at = 0;
      cranges = 0;
      end_at = fio_atol((char **)&start_at);
      if (end_at < (long)file_data.st_rdev) {
        if (-1 < end_at) {
          start_at = start_at + 1;
          cranges = fio_atol((char **)&start_at);
          if ((long)cranges < 1) goto LAB_0017222a;
        }
        if (end_at < 0) {
          if (-end_at < (long)file_data.st_rdev) {
            length = file_data.st_rdev - end_at;
            tmp_3 = -end_at;
          }
        }
        else {
          if (cranges == 0) {
            tmp_3 = _Var2 - end_at;
          }
          else {
            tmp_3 = (cranges - end_at) + 1;
            if (((long)file_data.st_rdev < (long)(tmp_3 + end_at)) || ((long)tmp_3 < 1)) {
              tmp_3 = tmp_3 - end_at;
            }
          }
          length = end_at;
        }
        h->status = 0xce;
        local_1f0 = fiobj_str_buf(1);
        fiobj_str_printf(local_1f0,"bytes %lu-%lu/%lu",end_at,end_at + tmp_3 + -1,file_data.st_rdev)
        ;
        http_set_header(h,HTTP_HEADER_CONTENT_RANGE,local_1f0);
        FVar5 = HTTP_HEADER_ACCEPT_RANGES;
        FVar7 = fiobj_dup(HTTP_HVALUE_BYTES);
        http_set_header(h,FVar5,FVar7);
        goto LAB_00172031;
      }
    }
LAB_0017222a:
    fiobj_obj2cstr((fio_str_info_s *)&tmp_4,(FIOBJ)tmp.data);
    tmp_1 = tmp_4;
    s.capa = local_248;
    s.len = (size_t)local_240;
    s.data._4_4_ = open(local_240,0);
    FVar5 = HTTP_HEADER_CONTENT_ENCODING;
    if (s.data._4_4_ == -1) {
      if (1 < FIO_LOG_LEVEL) {
        FIO_LOG2STDERR("ERROR: (HTTP) couldn\'t open file %s!\n",s.len);
      }
      perror("     ");
      http_send_error(h,500);
    }
    else {
      sVar6 = s.capa;
      if (s.data._3_1_ == '\0') {
        do {
          sVar1 = sVar6;
          local_260 = sVar1 - 1;
          bVar8 = false;
          if (local_260 != 0) {
            bVar8 = *(char *)(s.len + local_260) != '.';
          }
          sVar6 = local_260;
        } while (bVar8);
        pos_2 = http_mimetype_find((char *)(s.len + sVar1),s.capa - sVar1);
      }
      else {
        FVar7 = fiobj_dup(HTTP_HVALUE_GZIP);
        http_set_header(h,FVar5,FVar7);
        local_260 = s.capa - 4;
        while( true ) {
          bVar8 = false;
          if (local_260 != 0) {
            bVar8 = *(char *)(s.len + local_260) != '.';
          }
          if (!bVar8) break;
          local_260 = local_260 + -1;
        }
        pos_2 = http_mimetype_find((char *)(s.len + local_260 + 1),(s.capa - (local_260 + 1)) - 3);
      }
      if (pos_2 != 0) {
        http_set_header(h,HTTP_HEADER_CONTENT_TYPE,pos_2);
      }
      http_sendfile(h,s.data._4_4_,tmp_3,length);
    }
  }
  else {
    fiobj_hash_delete2(h->headers,http_sendfile2::range_hash);
LAB_00172031:
    fiobj_obj2cstr(&local_208,h->method);
    s.len = (size_t)local_208.data;
    tmp_1 = local_208.capa;
    s.capa = local_208.len;
    if (local_208.len == 3) {
      iVar3 = strncasecmp("get",local_208.data,3);
      if (iVar3 == 0) goto LAB_0017222a;
    }
    else if (local_208.len == 4) {
      iVar3 = strncasecmp("head",local_208.data,4);
      FVar5 = HTTP_HEADER_CONTENT_LENGTH;
      if (iVar3 == 0) {
        FVar7 = fiobj_num_new(tmp_3);
        http_set_header(h,FVar5,FVar7);
        http_finish(h);
        return 0;
      }
    }
    else if ((local_208.len == 7) && (iVar3 = strncasecmp("options",local_208.data,7), iVar3 == 0))
    {
      local_220 = 0;
      local_218 = 5;
      local_210 = "allow";
      local_238 = 0;
      local_230 = 9;
      local_228 = "GET, HEAD";
      n.data = "allow";
      n.capa = SUB168(ZEXT816(5) << 0x40,0);
      n.len = SUB168(ZEXT816(5) << 0x40,8);
      v.data = "GET, HEAD";
      v.capa = SUB168(ZEXT816(9) << 0x40,0);
      v.len = SUB168(ZEXT816(9) << 0x40,8);
      http_set_header2(h,n,v);
      h->status = 200;
      http_finish(h);
      return 0;
    }
    http_send_error(h,0x193);
  }
  return 0;
}

Assistant:

int http_sendfile2(http_s *h, const char *prefix, size_t prefix_len,
                   const char *encoded, size_t encoded_len) {
  if (HTTP_INVALID_HANDLE(h))
    return -1;
  struct stat file_data = {.st_size = 0};
  static uint64_t accept_enc_hash = 0;
  if (!accept_enc_hash)
    accept_enc_hash = fiobj_hash_string("accept-encoding", 15);
  static uint64_t range_hash = 0;
  if (!range_hash)
    range_hash = fiobj_hash_string("range", 5);

  /* create filename string */
  FIOBJ filename = fiobj_str_tmp();
  if (prefix && prefix_len) {
    /* start with prefix path */
    if (encoded && prefix[prefix_len - 1] == '/' && encoded[0] == '/')
      --prefix_len;
    fiobj_str_capa_assert(filename, prefix_len + encoded_len + 4);
    fiobj_str_write(filename, prefix, prefix_len);
  }
  {
    /* decode filename in cases where it's URL encoded */
    fio_str_info_s tmp = fiobj_obj2cstr(filename);
    if (encoded) {
      char *pos = (char *)encoded;
      const char *end = encoded + encoded_len;
      while (pos < end) {
        if (*pos == '%') {
          // decode hex value (this is a percent encoded value).
          if (hex2byte((uint8_t *)tmp.data + tmp.len, (uint8_t *)pos + 1))
            return -1;
          tmp.len++;
          pos += 3;
        } else
          tmp.data[tmp.len++] = *(pos++);
      }
      tmp.data[tmp.len] = 0;
      fiobj_str_resize(filename, tmp.len);
      /* test for path manipulations after decoding */
      if (http_test_encoded_path(tmp.data + prefix_len, tmp.len - prefix_len))
        return -1;
    }
    if (tmp.data[tmp.len - 1] == '/')
      fiobj_str_write(filename, "index.html", 10);
  }
  /* test for file existance  */

  int file = -1;
  uint8_t is_gz = 0;

  fio_str_info_s s = fiobj_obj2cstr(filename);
  {
    FIOBJ tmp = fiobj_hash_get2(h->headers, accept_enc_hash);
    if (!tmp)
      goto no_gzip_support;
    fio_str_info_s ac_str = fiobj_obj2cstr(tmp);
    if (!ac_str.data || !strstr(ac_str.data, "gzip"))
      goto no_gzip_support;
    if (s.data[s.len - 3] != '.' || s.data[s.len - 2] != 'g' ||
        s.data[s.len - 1] != 'z') {
      fiobj_str_write(filename, ".gz", 3);
      s = fiobj_obj2cstr(filename);
      if (!stat(s.data, &file_data) &&
          (S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode))) {
        is_gz = 1;
        goto found_file;
      }
      fiobj_str_resize(filename, s.len - 3);
    }
  }
no_gzip_support:
  if (stat(s.data, &file_data) ||
      !(S_ISREG(file_data.st_mode) || S_ISLNK(file_data.st_mode)))
    return -1;
found_file:
  /* set last-modified */
  {
    FIOBJ tmp = fiobj_str_buf(32);
    fiobj_str_resize(
        tmp, http_time2str(fiobj_obj2cstr(tmp).data, file_data.st_mtime));
    http_set_header(h, HTTP_HEADER_LAST_MODIFIED, tmp);
  }
  /* set cache-control */
  http_set_header(h, HTTP_HEADER_CACHE_CONTROL, fiobj_dup(HTTP_HVALUE_MAX_AGE));
  /* set & test etag */
  uint64_t etag = (uint64_t)file_data.st_size;
  etag ^= (uint64_t)file_data.st_mtime;
  etag = fiobj_hash_string(&etag, sizeof(uint64_t));
  FIOBJ etag_str = fiobj_str_buf(32);
  fiobj_str_resize(etag_str,
                   fio_base64_encode(fiobj_obj2cstr(etag_str).data,
                                     (void *)&etag, sizeof(uint64_t)));
  /* set */
  http_set_header(h, HTTP_HEADER_ETAG, etag_str);
  /* test */
  {
    static uint64_t none_match_hash = 0;
    if (!none_match_hash)
      none_match_hash = fiobj_hash_string("if-none-match", 13);
    FIOBJ tmp2 = fiobj_hash_get2(h->headers, none_match_hash);
    if (tmp2 && fiobj_iseq(tmp2, etag_str)) {
      h->status = 304;
      http_finish(h);
      return 0;
    }
  }
  /* handle range requests */
  int64_t offset = 0;
  int64_t length = file_data.st_size;
  {
    static uint64_t ifrange_hash = 0;
    if (!ifrange_hash)
      ifrange_hash = fiobj_hash_string("if-range", 8);
    FIOBJ tmp = fiobj_hash_get2(h->headers, ifrange_hash);
    if (tmp && fiobj_iseq(tmp, etag_str)) {
      fiobj_hash_delete2(h->headers, range_hash);
    } else {
      tmp = fiobj_hash_get2(h->headers, range_hash);
      if (tmp) {
        /* range ahead... */
        if (FIOBJ_TYPE_IS(tmp, FIOBJ_T_ARRAY))
          tmp = fiobj_ary_index(tmp, 0);
        fio_str_info_s range = fiobj_obj2cstr(tmp);
        if (!range.data || memcmp("bytes=", range.data, 6))
          goto open_file;
        char *pos = range.data + 6;
        int64_t start_at = 0, end_at = 0;
        start_at = fio_atol(&pos);
        if (start_at >= file_data.st_size)
          goto open_file;
        if (start_at >= 0) {
          pos++;
          end_at = fio_atol(&pos);
          if (end_at <= 0)
            goto open_file;
        }
        /* we ignore multimple ranges, only responding with the first range. */
        if (start_at < 0) {
          if (0 - start_at < file_data.st_size) {
            offset = file_data.st_size - start_at;
            length = 0 - start_at;
          }
        } else if (end_at) {
          offset = start_at;
          length = end_at - start_at + 1;
          if (length + start_at > file_data.st_size || length <= 0)
            length = length - start_at;
        } else {
          offset = start_at;
          length = length - start_at;
        }
        h->status = 206;

        {
          FIOBJ cranges = fiobj_str_buf(1);
          fiobj_str_printf(cranges, "bytes %lu-%lu/%lu",
                           (unsigned long)start_at,
                           (unsigned long)(start_at + length - 1),
                           (unsigned long)file_data.st_size);
          http_set_header(h, HTTP_HEADER_CONTENT_RANGE, cranges);
        }
        http_set_header(h, HTTP_HEADER_ACCEPT_RANGES,
                        fiobj_dup(HTTP_HVALUE_BYTES));
      }
    }
  }
  /* test for an OPTIONS request or invalid methods */
  s = fiobj_obj2cstr(h->method);
  switch (s.len) {
  case 7:
    if (!strncasecmp("options", s.data, 7)) {
      http_set_header2(h, (fio_str_info_s){.data = (char *)"allow", .len = 5},
                       (fio_str_info_s){.data = (char *)"GET, HEAD", .len = 9});
      h->status = 200;
      http_finish(h);
      return 0;
    }
    break;
  case 3:
    if (!strncasecmp("get", s.data, 3))
      goto open_file;
    break;
  case 4:
    if (!strncasecmp("head", s.data, 4)) {
      http_set_header(h, HTTP_HEADER_CONTENT_LENGTH, fiobj_num_new(length));
      http_finish(h);
      return 0;
    }
    break;
  }
  http_send_error(h, 403);
  return 0;
open_file:
  s = fiobj_obj2cstr(filename);
  file = open(s.data, O_RDONLY);
  if (file == -1) {
    FIO_LOG_ERROR("(HTTP) couldn't open file %s!\n", s.data);
    perror("     ");
    http_send_error(h, 500);
    return 0;
  }
  {
    FIOBJ tmp = 0;
    uintptr_t pos = 0;
    if (is_gz) {
      http_set_header(h, HTTP_HEADER_CONTENT_ENCODING,
                      fiobj_dup(HTTP_HVALUE_GZIP));

      pos = s.len - 4;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos - 3);

    } else {
      pos = s.len - 1;
      while (pos && s.data[pos] != '.')
        pos--;
      pos++; /* assuming, but that's fine. */
      tmp = http_mimetype_find(s.data + pos, s.len - pos);
    }
    if (tmp)
      http_set_header(h, HTTP_HEADER_CONTENT_TYPE, tmp);
  }
  http_sendfile(h, file, length, offset);
  return 0;
}